

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::setTransform(QGraphicsView *this,QTransform *matrix,bool combine)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  QGraphicsViewPrivate *pQVar4;
  ulong uVar5;
  byte in_DL;
  QGraphicsViewPrivate *in_RSI;
  long in_FS_OFFSET;
  QGraphicsViewPrivate *d;
  QTransform oldMatrix;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 local_a8 [4];
  ViewportAnchor in_stack_ffffffffffffff5c;
  QGraphicsViewPrivate *in_stack_ffffffffffffff60;
  undefined1 local_58 [56];
  QGraphicsViewPrivate *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_DL & 1;
  pQVar4 = d_func((QGraphicsView *)0xa39228);
  memcpy(local_58,&DAT_00b48348,0x50);
  memcpy(local_58,&pQVar4->matrix,0x50);
  if ((bVar2 & 1) == 0) {
    memcpy(&pQVar4->matrix,in_RSI,0x4a);
  }
  else {
    QTransform::operator*((QTransform *)local_a8,(QTransform *)in_RSI);
    memcpy(&pQVar4->matrix,local_a8,0x4a);
  }
  uVar5 = QTransform::operator==((QTransform *)local_58,(QTransform *)&pQVar4->matrix);
  if ((uVar5 & 1) == 0) {
    bVar3 = QTransform::isIdentity((QTransform *)0xa392e3);
    *(uint *)&pQVar4->field_0x300 = *(uint *)&pQVar4->field_0x300 & 0xffffffef | (uint)bVar3 << 4;
    *(uint *)&pQVar4->field_0x300 = *(uint *)&pQVar4->field_0x300 & 0xfffffeff | 0x100;
    bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3932f);
    if (bVar3) {
      QGraphicsViewPrivate::recalculateContentSize(in_stack_ffffffffffffffe0);
      QGraphicsViewPrivate::centerView(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    }
    else {
      QGraphicsViewPrivate::updateLastCenterPoint(in_RSI);
    }
    if ((*(uint *)&pQVar4->field_0x300 & 1) != 0) {
      QGraphicsViewPrivate::replayLastMouseEvent
                ((QGraphicsViewPrivate *)CONCAT17(bVar2,in_stack_ffffffffffffff40));
    }
    *(uint *)&pQVar4->field_0x300 = *(uint *)&pQVar4->field_0x300 & 0xfffffeff;
    QGraphicsViewPrivate::updateAll
              ((QGraphicsViewPrivate *)CONCAT17(bVar2,in_stack_ffffffffffffff40));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::setTransform(const QTransform &matrix, bool combine )
{
    Q_D(QGraphicsView);
    QTransform oldMatrix = d->matrix;
    if (!combine)
        d->matrix = matrix;
    else
        d->matrix = matrix * d->matrix;
    if (oldMatrix == d->matrix)
        return;

    d->identityMatrix = d->matrix.isIdentity();
    d->transforming = true;
    if (d->scene) {
        d->recalculateContentSize();
        d->centerView(d->transformationAnchor);
    } else {
        d->updateLastCenterPoint();
    }

    if (d->sceneInteractionAllowed)
        d->replayLastMouseEvent();
    d->transforming = false;

    // Any matrix operation requires a full update.
    d->updateAll();
}